

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall ChainstateManager::DeleteSnapshotChainstate(ChainstateManager *this)

{
  undefined1 uVar1;
  byte bVar2;
  pointer pCVar3;
  char *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  Level in_stack_00000050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000060;
  path snapshot_datadir;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  path *in_stack_fffffffffffffeb0;
  optional<fs::path> *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  undefined5 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecd;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  char *in_stack_fffffffffffffed0;
  path *in_stack_fffffffffffffed8;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *in_stack_fffffffffffffee8;
  optional<fs::path> *val;
  char *flag;
  int in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff37;
  path *in_stack_ffffffffffffff38;
  ConstevalFormatString<1U> in_stack_ffffffffffffff58;
  string_view in_stack_ffffffffffffff60;
  string_view in_stack_ffffffffffffff70;
  optional<fs::path> local_60;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffeac,(AnnotatedMixin<std::recursive_mutex> *)0x14b05f5);
  inline_assertion_check<true,std::unique_ptr<Chainstate,std::default_delete<Chainstate>>&>
            (in_stack_fffffffffffffee8,in_RDI,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             in_stack_fffffffffffffed0,
             (char *)CONCAT17(in_stack_fffffffffffffecf,
                              CONCAT16(in_stack_fffffffffffffece,
                                       CONCAT15(in_stack_fffffffffffffecd,in_stack_fffffffffffffec8)
                                      )));
  inline_assertion_check<true,std::unique_ptr<Chainstate,std::default_delete<Chainstate>>&>
            (in_stack_fffffffffffffee8,in_RDI,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             in_stack_fffffffffffffed0,
             (char *)CONCAT17(in_stack_fffffffffffffecf,
                              CONCAT16(in_stack_fffffffffffffece,
                                       CONCAT15(in_stack_fffffffffffffecd,in_stack_fffffffffffffec8)
                                      )));
  val = &local_60;
  ::node::FindSnapshotChainstateDir(in_stack_fffffffffffffed8);
  inline_assertion_check<true,std::optional<fs::path>>
            (val,in_RDI,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),in_stack_fffffffffffffed0,
             (char *)CONCAT17(in_stack_fffffffffffffecf,
                              CONCAT16(in_stack_fffffffffffffece,
                                       CONCAT15(in_stack_fffffffffffffecd,in_stack_fffffffffffffec8)
                                      )));
  std::optional<fs::path>::value(in_stack_fffffffffffffeb8);
  fs::path::path((path *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (path *)0x14b06ad);
  std::optional<fs::path>::~optional
            ((optional<fs::path> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  fs::path::path((path *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (path *)0x14b06cc);
  uVar1 = DeleteCoinsDBFromDisk(in_stack_ffffffffffffff38,(bool)in_stack_ffffffffffffff37);
  bVar2 = uVar1 ^ 0xff;
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  bVar4 = (bVar2 & 1) != 0;
  if (bVar4) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(in_stack_fffffffffffffecd,
                                                      in_stack_fffffffffffffec8))),
               in_stack_fffffffffffffec0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(in_stack_fffffffffffffecd,
                                                      in_stack_fffffffffffffec8))),
               in_stack_fffffffffffffec0);
    flag = "Deletion of %s failed. Please remove it manually to continue reindexing.\n";
    fs::PathToString_abi_cxx11_(in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffea8 = 2;
    LogPrintFormatInternal<std::__cxx11::string>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff60,in_stack_ffffffffffffff1c,
               (LogFlags)flag,in_stack_00000050,in_stack_ffffffffffffff58,in_stack_00000060);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  else {
    pCVar3 = std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
                       ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    *(pointer *)(in_RDI + 0x10) = pCVar3;
    pCVar3 = std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                       ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    *(CTxMemPool **)(*(long *)(in_RDI + 0x10) + 0x28) = pCVar3->m_mempool;
    std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::reset
              ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),(pointer)0x14b0886);
  }
  bVar2 = !bVar4;
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::DeleteSnapshotChainstate()
{
    AssertLockHeld(::cs_main);
    Assert(m_snapshot_chainstate);
    Assert(m_ibd_chainstate);

    fs::path snapshot_datadir = Assert(node::FindSnapshotChainstateDir(m_options.datadir)).value();
    if (!DeleteCoinsDBFromDisk(snapshot_datadir, /*is_snapshot=*/ true)) {
        LogPrintf("Deletion of %s failed. Please remove it manually to continue reindexing.\n",
                  fs::PathToString(snapshot_datadir));
        return false;
    }
    m_active_chainstate = m_ibd_chainstate.get();
    m_active_chainstate->m_mempool = m_snapshot_chainstate->m_mempool;
    m_snapshot_chainstate.reset();
    return true;
}